

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall write_slot::operator()(write_slot *this,wm_slot_le *slot,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  wm_slot_le *slot_local;
  write_slot *this_local;
  
  value = std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::size
                    (&slot->wallmarks);
  xray_re::xr_writer::w_size_u32(w,value);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  xray_re::xr_writer::
  w_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,write_wallmark>
            (w,&slot->wallmarks);
  return;
}

Assistant:

void operator()(const wm_slot_le* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wallmark());
}